

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::
initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper::
RunImpl(initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
        *this)

{
  UtcTimeOnly *this_00;
  string *psVar1;
  TestResults *this_01;
  string *psVar2;
  string *senderCompID;
  string *targetCompID;
  BeginString *pBVar3;
  DataDictionary *pDVar4;
  Session *pSVar5;
  TestResults **ppTVar6;
  TestDetails **ppTVar7;
  UtcTimeStamp *val;
  UtcTimeStamp *val_00;
  TestDetails local_1250;
  InvalidMessage *anon_var_0;
  byte local_1209;
  undefined1 local_1208 [7];
  bool caught_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  allocator<char> local_fa1;
  undefined1 local_fa0 [8];
  string delimSOH;
  string newOrderSingleRawFIX;
  NewOrderSingle newOrderSingle;
  STRING local_e00;
  StringField local_de0;
  allocator<char> local_d79;
  STRING local_d78;
  StringField local_d58;
  shared_ptr<FIX::DataDictionary> local_cf8;
  allocator<char> local_ce1;
  STRING local_ce0;
  ApplVerID local_cc0;
  shared_ptr<FIX::DataDictionary> local_c60;
  undefined1 local_c50 [8];
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  DataDictionary dictionary;
  allocator<char> local_851;
  string local_850;
  undefined1 local_830 [8];
  DataDictionaryProvider provider;
  TimeRange sessionTime;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  STRING local_378;
  StringField local_358;
  allocator<char> local_2f1;
  STRING local_2f0;
  StringField local_2d0;
  allocator<char> local_259;
  STRING local_258;
  StringField local_238;
  undefined1 local_1d8 [8];
  SessionID sessionID;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
  *local_10;
  initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
  *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::UtcTimeStamp(&local_28,8,8,8,0xd,5,0x7df);
  val = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  val_00 = &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(val_00,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  this_00 = (UtcTimeOnly *)(&sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  FIX::UtcTimeOnly::UtcTimeOnly(this_00,&val_00->super_DateTime);
  FIX::UtcTimeOnly::operator=
            (&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,this_00
            );
  FIX::UtcTimeOnly::~UtcTimeOnly(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"FIXT.1.1",&local_259);
  FIX::BeginString::BeginString((BeginString *)&local_238,&local_258);
  psVar2 = FIX::StringField::operator_cast_to_string_(&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"TW",&local_2f1);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_2d0,&local_2f0);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"ISLD",&local_379);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_358,&local_378);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"",&local_3a1);
  FIX::SessionID::SessionID((SessionID *)local_1d8,psVar2,senderCompID,targetCompID,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  FIX::BeginString::~BeginString((BeginString *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  FIX::TimeRange::TimeRange
            ((TimeRange *)&provider.field_0x440,
             &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,0,0x1f)
  ;
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_830);
  pBVar3 = FIX::SessionID::getBeginString((SessionID *)local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"../spec/FIXT11.xml",&local_851);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)local_830,pBVar3,&local_850);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  FIX::SessionID::getBeginString((SessionID *)local_1d8);
  pDVar4 = (DataDictionary *)
           FIX::DataDictionaryProvider::getSessionDataDictionary((BeginString *)local_830);
  FIX::DataDictionary::DataDictionary
            ((DataDictionary *)
             &pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pDVar4);
  std::make_shared<FIX::DataDictionary,FIX::DataDictionary&>((DataDictionary *)local_c50);
  pBVar3 = FIX::SessionID::getBeginString((SessionID *)local_1d8);
  std::shared_ptr<FIX::DataDictionary>::shared_ptr
            (&local_c60,(shared_ptr<FIX::DataDictionary> *)local_c50);
  FIX::DataDictionaryProvider::addTransportDataDictionary(local_830,pBVar3,&local_c60);
  std::shared_ptr<FIX::DataDictionary>::~shared_ptr(&local_c60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce0,"20",&local_ce1);
  FIX::ApplVerID::ApplVerID(&local_cc0,&local_ce0);
  std::shared_ptr<FIX::DataDictionary>::shared_ptr
            (&local_cf8,(shared_ptr<FIX::DataDictionary> *)local_c50);
  FIX::DataDictionaryProvider::addApplicationDataDictionary(local_830,&local_cc0,&local_cf8);
  std::shared_ptr<FIX::DataDictionary>::~shared_ptr(&local_cf8);
  FIX::ApplVerID::~ApplVerID(&local_cc0);
  std::__cxx11::string::~string((string *)&local_ce0);
  std::allocator<char>::~allocator(&local_ce1);
  pSVar5 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (pSVar5,&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                     super_NullApplication.super_Application,
             (MessageStoreFactory *)&(this->super_initiatorFixture).super_sessionFixture.factory,
             (SessionID *)local_1d8,(DataDictionaryProvider *)local_830,
             (TimeRange *)&provider.field_0x440,1,(LogFactory *)0x0);
  (this->super_initiatorFixture).super_sessionFixture.object = pSVar5;
  pSVar5 = (this->super_initiatorFixture).super_sessionFixture.object;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d78,"20",&local_d79);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_d58,&local_d78);
  psVar2 = FIX::StringField::operator_cast_to_string_(&local_d58);
  FIX::Session::setSenderDefaultApplVerID(pSVar5,psVar2);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_d58);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  pSVar5 = (this->super_initiatorFixture).super_sessionFixture.object;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e00,"20",(allocator<char> *)&newOrderSingle.super_Message.field_0x157)
  ;
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_de0,&local_e00);
  psVar2 = FIX::StringField::operator_cast_to_string_(&local_de0);
  FIX::Session::setTargetDefaultApplVerID(pSVar5,psVar2);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_de0);
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&newOrderSingle.super_Message.field_0x157);
  FIX42::NewOrderSingle::NewOrderSingle((NewOrderSingle *)((long)&newOrderSingleRawFIX.field_2 + 8))
  ;
  std::__cxx11::string::string((string *)(delimSOH.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_fa0,"\x01",&local_fa1);
  std::allocator<char>::~allocator(&local_fa1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208,
                 "8=FIXT.4.2",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_11e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1208,
                 "35=A");
  std::operator+(&local_11c8,&local_11e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_11a8,&local_11c8,"9=114");
  std::operator+(&local_1188,&local_11a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_1168,&local_1188,"34=2");
  std::operator+(&local_1148,&local_1168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_1128,&local_1148,"49=ISLD");
  std::operator+(&local_1108,&local_1128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_10e8,&local_1108,"56=TW");
  std::operator+(&local_10c8,&local_10e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_10a8,&local_10c8,"52=20190517-16:08:43");
  std::operator+(&local_1088,&local_10a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_1068,&local_1088,"98=0");
  std::operator+(&local_1048,&local_1068,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_1028,&local_1048,"108=1");
  std::operator+(&local_1008,&local_1028,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::operator+(&local_fe8,&local_1008,"10=166");
  std::operator+(&local_fc8,&local_fe8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa0);
  std::__cxx11::string::operator=
            ((string *)(delimSOH.field_2._M_local_buf + 8),(string *)&local_fc8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::__cxx11::string::~string((string *)&local_fe8);
  std::__cxx11::string::~string((string *)&local_1008);
  std::__cxx11::string::~string((string *)&local_1028);
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string((string *)&local_1068);
  std::__cxx11::string::~string((string *)&local_1088);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::__cxx11::string::~string((string *)&local_1108);
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::~string((string *)&local_1148);
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_1188);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string((string *)local_1208);
  local_1209 = 0;
  psVar1 = (string *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&anon_var_0);
  FIX::Session::next(psVar1,(UtcTimeStamp *)((long)&delimSOH.field_2 + 8),SUB81(&anon_var_0,0));
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&anon_var_0);
  if ((local_1209 & 1) == 0) {
    ppTVar6 = UnitTest::CurrentTest::Results();
    this_01 = *ppTVar6;
    ppTVar7 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1250,*ppTVar7,0xa4e);
    UnitTest::TestResults::OnTestFailure
              (this_01,&local_1250,"Expected exception: \"InvalidMessage\" not thrown");
  }
  std::__cxx11::string::~string((string *)local_fa0);
  std::__cxx11::string::~string((string *)(delimSOH.field_2._M_local_buf + 8));
  FIX42::NewOrderSingle::~NewOrderSingle
            ((NewOrderSingle *)((long)&newOrderSingleRawFIX.field_2 + 8));
  std::shared_ptr<FIX::DataDictionary>::~shared_ptr((shared_ptr<FIX::DataDictionary> *)local_c50);
  FIX::DataDictionary::~DataDictionary
            ((DataDictionary *)
             &pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FIX::DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_830);
  FIX::TimeRange::~TimeRange((TimeRange *)&provider.field_0x440);
  FIX::SessionID::~SessionID((SessionID *)local_1d8);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, InvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException) {

  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIXT.1.1" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
  provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

  object = new Session( *this, factory, sessionID, provider,
      sessionTime, 1, 0 );
  object->setSenderDefaultApplVerID(ApplVerID("20"));
  object->setTargetDefaultApplVerID(ApplVerID("20"));


  FIX42::NewOrderSingle newOrderSingle;
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIXT.4.2" + delimSOH
      + "35=A" + delimSOH
      + "9=114" + delimSOH
      + "34=2" + delimSOH
      + "49=ISLD" + delimSOH
      + "56=TW" + delimSOH
      + "52=20190517-16:08:43" + delimSOH
      + "98=0" + delimSOH
      + "108=1" + delimSOH
      + "10=166" + delimSOH;

  CHECK_THROW(object->next(newOrderSingleRawFIX, UtcTimeStamp()), InvalidMessage);
}